

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O3

int ks_getuntil2(kstream_t *ks,int delimiter,kstring_t *str,int *dret,int append)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  uchar *puVar8;
  byte *pbVar9;
  size_t __size;
  int iVar10;
  int iVar11;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (append == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = str->l;
  }
  str->l = sVar3;
  iVar1 = ks->begin;
  iVar2 = ks->end;
  bVar7 = true;
  do {
    if (iVar2 <= iVar1) {
      if (ks->is_eof == 0) {
        ks->begin = 0;
        iVar2 = gzread(ks->f,ks->buf,0xffff);
        ks->end = iVar2;
        if (iVar2 != 0) goto LAB_001055aa;
        ks->is_eof = 1;
        iVar2 = 0;
      }
      if ((bVar7) && (iVar2 <= ks->begin)) {
        return -1;
      }
      break;
    }
LAB_001055aa:
    iVar1 = ks->begin;
    iVar11 = iVar1;
    if (delimiter == 0) {
      if (iVar1 < iVar2) {
        ppuVar4 = __ctype_b_loc();
        pbVar9 = ks->buf + iVar1;
        iVar10 = iVar1;
        do {
          iVar11 = iVar10;
          if ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar9 * 2 + 1) & 0x20) != 0) break;
          iVar10 = iVar10 + 1;
          pbVar9 = pbVar9 + 1;
          iVar11 = iVar2;
        } while (iVar2 != iVar10);
      }
    }
    else if (delimiter == 2) {
      if (iVar1 < iVar2) {
        puVar8 = ks->buf + iVar1;
        iVar10 = iVar1;
        do {
          iVar11 = iVar10;
          if (*puVar8 == '\n') break;
          iVar10 = iVar10 + 1;
          puVar8 = puVar8 + 1;
          iVar11 = iVar2;
        } while (iVar2 != iVar10);
      }
    }
    else if (iVar1 < iVar2) {
      ppuVar4 = __ctype_b_loc();
      pbVar9 = ks->buf + iVar1;
      iVar10 = iVar1;
      do {
        if ((*pbVar9 != 0x20) && (iVar11 = iVar10, ((*ppuVar4)[*pbVar9] & 0x2000) != 0)) break;
        iVar10 = iVar10 + 1;
        pbVar9 = pbVar9 + 1;
        iVar11 = iVar2;
      } while (iVar2 != iVar10);
    }
    sVar3 = str->l;
    iVar2 = iVar11 - iVar1;
    pcVar5 = str->s;
    if (str->m - sVar3 < (ulong)(long)(iVar2 + 1)) {
      uVar6 = sVar3 + (long)iVar2 >> 1 | sVar3 + (long)iVar2;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar6 = uVar6 >> 8 | uVar6;
      __size = (uVar6 >> 0x10 | uVar6) + 1;
      str->m = __size;
      pcVar5 = (char *)realloc(pcVar5,__size);
      str->s = pcVar5;
      sVar3 = str->l;
      iVar1 = ks->begin;
      iVar2 = iVar11 - iVar1;
    }
    memcpy(pcVar5 + sVar3,ks->buf + iVar1,(long)iVar2);
    str->l = str->l + ((long)iVar11 - (long)ks->begin);
    iVar1 = iVar11 + 1;
    ks->begin = iVar1;
    iVar2 = ks->end;
    if ((dret != (int *)0x0) && (iVar11 < iVar2)) {
      *dret = (uint)ks->buf[iVar11];
      break;
    }
    bVar7 = false;
  } while (iVar2 <= iVar11);
  pcVar5 = str->s;
  if (pcVar5 == (char *)0x0) {
    str->m = 1;
    pcVar5 = (char *)calloc(1,1);
    str->s = pcVar5;
    uVar6 = str->l;
  }
  else {
    uVar6 = str->l;
    if ((1 < uVar6 && delimiter == 2) && (pcVar5[uVar6 - 1] == '\r')) {
      uVar6 = uVar6 - 1;
      str->l = uVar6;
    }
  }
  pcVar5[uVar6] = '\0';
  return (int)str->l;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}